

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::ScanLineInputFile::~ScanLineInputFile(ScanLineInputFile *this)

{
  Data *this_00;
  pointer ppLVar1;
  ulong uVar2;
  
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__ScanLineInputFile_003806f0;
  if ((this->_data->memoryMapped == false) &&
     (ppLVar1 = (this->_data->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (this->_data->lineBuffers).
     super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
     ._M_impl.super__Vector_impl_data._M_finish != ppLVar1)) {
    uVar2 = 0;
    do {
      free((ppLVar1[uVar2]->buffer)._data);
      uVar2 = uVar2 + 1;
      ppLVar1 = (this->_data->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->_data->lineBuffers).
                                   super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3))
    ;
  }
  if ((this->_data->partNumber == -1) && (this->_streamData != (InputStreamMutex *)0x0)) {
    operator_delete(this->_streamData,0x38);
  }
  this_00 = this->_data;
  if (this_00 != (Data *)0x0) {
    Data::~Data(this_00);
    operator_delete(this_00,0x168);
  }
  GenericInputFile::~GenericInputFile(&this->super_GenericInputFile);
  return;
}

Assistant:

ScanLineInputFile::~ScanLineInputFile ()
{
    if (!_data->memoryMapped)
    {
        for (size_t i = 0; i < _data->lineBuffers.size(); i++)
        {
            EXRFreeAligned(_data->lineBuffers[i]->buffer);
        }
    }
            

    //
    // ScanLineInputFile should never delete the stream,
    // because it does not own the stream.
    // We just delete the Mutex here.
    //
    if (_data->partNumber == -1)
        delete _streamData;

    delete _data;
}